

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

void __thiscall SubprocessTestSetWithMulti::Run(SubprocessTestSetWithMulti *this)

{
  char *__s;
  Test *pTVar1;
  bool bVar2;
  ExitStatus EVar3;
  Subprocess *pSVar4;
  size_type sVar5;
  string *psVar6;
  size_type sVar7;
  byte local_d1;
  int local_8c;
  int local_88;
  int i_2;
  int i_1;
  allocator<char> local_71;
  string local_70;
  int local_4c;
  undefined *puStack_48;
  int i;
  char *kCommands [3];
  Subprocess *local_28;
  Subprocess *processes [3];
  SubprocessTestSetWithMulti *this_local;
  
  processes[2] = (Subprocess *)this;
  puStack_48 = (anonymous_namespace)::kSimpleCommand;
  kCommands[0] = "id -u";
  kCommands[1] = "pwd";
  for (local_4c = 0; pTVar1 = g_current_test, local_4c < 3; local_4c = local_4c + 1) {
    __s = *(char **)((long)&stack0xffffffffffffffb8 + (long)local_4c * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_71);
    pSVar4 = SubprocessSet::Add(&(this->super_SubprocessTest).subprocs_,&local_70,false);
    processes[(long)local_4c + -1] = pSVar4;
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    bVar2 = testing::Test::Check
                      (g_current_test,processes[(long)local_4c + -1] != (Subprocess *)0x0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                       ,0xe7,"(Subprocess *) 0 != processes[i]");
    if (!bVar2) {
      testing::Test::AddAssertionFailure(g_current_test);
      return;
    }
  }
  sVar5 = std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::size
                    (&(this->super_SubprocessTest).subprocs_.running_);
  bVar2 = testing::Test::Check
                    (pTVar1,sVar5 == 3,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0xea,"3u == subprocs_.running_.size()");
  if (bVar2) {
    for (local_88 = 0; pTVar1 = g_current_test, local_88 < 3; local_88 = local_88 + 1) {
      bVar2 = Subprocess::Done(processes[(long)local_88 + -1]);
      bVar2 = testing::Test::Check
                        (pTVar1,(bool)((bVar2 ^ 0xffU) & 1),
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                         ,0xec,"processes[i]->Done()");
      pTVar1 = g_current_test;
      if (!bVar2) {
        testing::Test::AddAssertionFailure(g_current_test);
        return;
      }
      psVar6 = Subprocess::GetOutput_abi_cxx11_(processes[(long)local_88 + -1]);
      bVar2 = std::operator==("",psVar6);
      bVar2 = testing::Test::Check
                        (pTVar1,bVar2,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                         ,0xed,"\"\" == processes[i]->GetOutput()");
      if (!bVar2) {
        testing::Test::AddAssertionFailure(g_current_test);
        return;
      }
    }
    SubprocessSet::ResetTokenAvailable(&(this->super_SubprocessTest).subprocs_);
    while( true ) {
      bVar2 = Subprocess::Done(local_28);
      local_d1 = 1;
      if (bVar2) {
        bVar2 = Subprocess::Done(processes[0]);
        local_d1 = 1;
        if (bVar2) {
          bVar2 = Subprocess::Done(processes[1]);
          local_d1 = bVar2 ^ 0xff;
        }
      }
      pTVar1 = g_current_test;
      if ((local_d1 & 1) == 0) {
        bVar2 = SubprocessSet::IsTokenAvailable(&(this->super_SubprocessTest).subprocs_);
        bVar2 = testing::Test::Check
                          (pTVar1,(bool)((bVar2 ^ 0xffU) & 1),
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                           ,0xf6,"subprocs_.IsTokenAvailable()");
        pTVar1 = g_current_test;
        if (!bVar2) {
          testing::Test::AddAssertionFailure(g_current_test);
          return;
        }
        sVar5 = std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::size
                          (&(this->super_SubprocessTest).subprocs_.running_);
        bVar2 = testing::Test::Check
                          (pTVar1,sVar5 == 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                           ,0xf7,"0u == subprocs_.running_.size()");
        pTVar1 = g_current_test;
        if (bVar2) {
          sVar7 = std::queue<Subprocess_*,_std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>_>
                  ::size(&(this->super_SubprocessTest).subprocs_.finished_);
          bVar2 = testing::Test::Check
                            (pTVar1,sVar7 == 3,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                             ,0xf8,"3u == subprocs_.finished_.size()");
          if (!bVar2) {
            testing::Test::AddAssertionFailure(g_current_test);
            return;
          }
          local_8c = 0;
          while( true ) {
            pTVar1 = g_current_test;
            if (2 < local_8c) {
              return;
            }
            EVar3 = Subprocess::Finish(processes[(long)local_8c + -1]);
            bVar2 = testing::Test::Check
                              (pTVar1,EVar3 == ExitSuccess,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                               ,0xfb,"ExitSuccess == processes[i]->Finish()");
            pTVar1 = g_current_test;
            if (!bVar2) break;
            psVar6 = Subprocess::GetOutput_abi_cxx11_(processes[(long)local_8c + -1]);
            bVar2 = std::operator!=("",psVar6);
            bVar2 = testing::Test::Check
                              (pTVar1,bVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                               ,0xfc,"\"\" != processes[i]->GetOutput()");
            if (!bVar2) {
              testing::Test::AddAssertionFailure(g_current_test);
              return;
            }
            pSVar4 = processes[(long)local_8c + -1];
            if (pSVar4 != (Subprocess *)0x0) {
              Subprocess::~Subprocess(pSVar4);
              operator_delete(pSVar4,0x30);
            }
            local_8c = local_8c + 1;
          }
          testing::Test::AddAssertionFailure(g_current_test);
          return;
        }
        testing::Test::AddAssertionFailure(g_current_test);
        return;
      }
      sVar5 = std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::size
                        (&(this->super_SubprocessTest).subprocs_.running_);
      bVar2 = testing::Test::Check
                        (pTVar1,sVar5 != 0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                         ,0xf3,"subprocs_.running_.size() > 0u");
      if (!bVar2) break;
      SubprocessSet::DoWork(&(this->super_SubprocessTest).subprocs_,(TokenPool *)0x0);
    }
    testing::Test::AddAssertionFailure(g_current_test);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(SubprocessTest, SetWithMulti) {
  Subprocess* processes[3];
  const char* kCommands[3] = {
    kSimpleCommand,
#ifdef _WIN32
    "cmd /c echo hi",
    "cmd /c time /t",
#else
    "id -u",
    "pwd",
#endif
  };

  for (int i = 0; i < 3; ++i) {
    processes[i] = subprocs_.Add(kCommands[i]);
    ASSERT_NE((Subprocess *) 0, processes[i]);
  }

  ASSERT_EQ(3u, subprocs_.running_.size());
  for (int i = 0; i < 3; ++i) {
    ASSERT_FALSE(processes[i]->Done());
    ASSERT_EQ("", processes[i]->GetOutput());
  }

  subprocs_.ResetTokenAvailable();
  while (!processes[0]->Done() || !processes[1]->Done() ||
         !processes[2]->Done()) {
    ASSERT_GT(subprocs_.running_.size(), 0u);
    subprocs_.DoWork(NULL);
  }
  ASSERT_FALSE(subprocs_.IsTokenAvailable());
  ASSERT_EQ(0u, subprocs_.running_.size());
  ASSERT_EQ(3u, subprocs_.finished_.size());

  for (int i = 0; i < 3; ++i) {
    ASSERT_EQ(ExitSuccess, processes[i]->Finish());
    ASSERT_NE("", processes[i]->GetOutput());
    delete processes[i];
  }
}